

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O0

void __thiscall sc_dt::scfx_rep::scfx_rep(scfx_rep *this,sc_unsigned *a)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64 uVar4;
  sc_unsigned *in_RSI;
  scfx_rep *in_RDI;
  scfx_index x;
  int i;
  int words;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  scfx_rep *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  scfx_rep *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  scfx_index local_2c;
  int local_24;
  int local_20;
  sc_unsigned *local_10;
  
  local_10 = in_RSI;
  scfx_mant::scfx_mant
            (&in_stack_ffffffffffffff70->m_mant,
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  in_RDI->m_wp = 0;
  in_RDI->m_sign = 0;
  in_RDI->m_state = normal;
  in_RDI->m_msw = 0;
  in_RDI->m_lsw = 0;
  in_RDI->m_r_flag = false;
  bVar1 = sc_unsigned::iszero((sc_unsigned *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (bVar1) {
    set_zero(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  else {
    iVar2 = sc_unsigned::length(local_10);
    iVar2 = n_word(iVar2);
    local_20 = iVar2;
    iVar3 = size((scfx_rep *)0x25ea61);
    if (iVar3 < iVar2) {
      resize_to(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    }
    scfx_mant::clear(&in_stack_ffffffffffffff70->m_mant);
    in_RDI->m_wp = 0;
    in_RDI->m_state = normal;
    local_24 = 0;
    while( true ) {
      iVar2 = local_24;
      iVar3 = sc_unsigned::length(local_10);
      if (iVar3 <= iVar2) break;
      sc_unsigned::operator[]((sc_unsigned *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      uVar4 = sc_unsigned_bitref_r::operator_cast_to_unsigned_long_long
                        ((sc_unsigned_bitref_r *)0x25eafb);
      if (uVar4 != 0) {
        local_2c = calc_indices((scfx_rep *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
        iVar2 = scfx_index::bi(&local_2c);
        in_stack_ffffffffffffff7c = 1 << ((byte)iVar2 & 0x1f);
        in_stack_ffffffffffffff80 = in_RDI;
        iVar2 = scfx_index::wi(&local_2c);
        in_stack_ffffffffffffff70 =
             (scfx_rep *)scfx_mant::operator[](&in_stack_ffffffffffffff80->m_mant,iVar2);
        *(uint *)&(in_stack_ffffffffffffff70->m_mant).m_array =
             in_stack_ffffffffffffff7c | *(uint *)&(in_stack_ffffffffffffff70->m_mant).m_array;
      }
      local_24 = local_24 + 1;
    }
    in_RDI->m_sign = 1;
    find_sw(in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

scfx_rep::scfx_rep( const sc_unsigned& a )
: m_mant( min_mant ), m_wp(), m_sign(), m_state(), m_msw(), m_lsw(),
  m_r_flag( false )
{
    if( a.iszero() )
	set_zero();
    else
    {
	int words = n_word( a.length() );
	if( words > size() )
	    resize_to( words );
	m_mant.clear();
	m_wp = 0;
	m_state = normal;
	for( int i = 0; i < a.length(); ++ i )
	{
	    if( a[i] )
	    {
		scfx_index x = calc_indices( i );
		m_mant[x.wi()] |= 1 << x.bi();
	    }
	}
	m_sign = 1;
	find_sw();
    }
}